

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O2

int wally_psbt_output_set_unknowns(wally_psbt_output *parent,wally_map *map_in)

{
  int iVar1;
  
  if (parent != (wally_psbt_output *)0x0) {
    iVar1 = map_assign(map_in,&parent->unknowns,(_func_int_uchar_ptr_size_t *)0x0);
    return iVar1;
  }
  return -2;
}

Assistant:

int wally_psbt_output_set_blinding_pubkey(struct wally_psbt_output *output,
                                          const unsigned char *pub_key,
                                          size_t pub_key_len)
{
    int ret;
    if (!output || BYTES_INVALID(pub_key, pub_key_len))
        return WALLY_EINVAL;
    if (pub_key &&
        (ret = wally_ec_public_key_verify(pub_key, pub_key_len)) != WALLY_OK)
        return ret;
    return replace_bytes(pub_key, pub_key_len,
                         &output->blinding_pubkey, &output->blinding_pubkey_len);
}